

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fms.c
# Opt level: O0

int FmsDataCollectionCreate(FmsMesh mesh,char *dc_name,FmsDataCollection *dc)

{
  int iVar1;
  char *__ptr;
  char **in_RDX;
  char *in_RSI;
  long in_RDI;
  FmsDataCollection dcoll;
  int local_4;
  
  if (in_RDI == 0) {
    local_4 = 1;
  }
  else if (in_RDX == (char **)0x0) {
    local_4 = 2;
  }
  else {
    __ptr = (char *)calloc(1,0x38);
    if (__ptr == (char *)0x0) {
      local_4 = 3;
    }
    else {
      iVar1 = FmsCopyString(in_RSI,in_RDX);
      if (iVar1 == 0) {
        *(long *)(__ptr + 0x10) = in_RDI;
        *in_RDX = __ptr;
        local_4 = 0;
      }
      else {
        free(__ptr);
        local_4 = 3;
      }
    }
  }
  return local_4;
}

Assistant:

int FmsDataCollectionCreate(FmsMesh mesh, const char *dc_name,
                            FmsDataCollection *dc) {
  if (!mesh) { E_RETURN(1); }
  if (!dc) { E_RETURN(2); }
  FmsDataCollection dcoll;
  dcoll = calloc(1, sizeof(*dcoll));
  if (dcoll == NULL) { E_RETURN(3); }
  // On error, call free(dcoll)
  // Init dcoll
  if (FmsCopyString(dc_name, &dcoll->name)) { free(dcoll); E_RETURN(3); }
  dcoll->mesh = mesh;
  *dc = dcoll;
  return 0;
}